

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool AddLocal(CNetAddr *addr,int nScore)

{
  bool bVar1;
  uint16_t portIn;
  long in_FS_OFFSET;
  direct_or_indirect local_48;
  uint local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  portIn = GetListenPort();
  CService::CService((CService *)&local_48.indirect_contents,addr,portIn);
  bVar1 = AddLocal((CService *)&local_48.indirect_contents,nScore);
  if (0x10 < local_38) {
    free(local_48.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CNetAddr &addr, int nScore)
{
    return AddLocal(CService(addr, GetListenPort()), nScore);
}